

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseVfpuCondition(MipsParser *this,Parser *parser,int *result)

{
  ulong uVar1;
  size_t this_00;
  bool bVar2;
  size_t sVar3;
  string_view local_50;
  ulong local_40;
  size_t i;
  Identifier *stringValue;
  Token *token;
  int *result_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  token = (Token *)result;
  result_local = (int *)parser;
  parser_local = (Parser *)this;
  stringValue = (Identifier *)Parser::nextToken(parser);
  if (((Token *)stringValue)->type == Identifier) {
    i = (size_t)Token::identifierValue((Token *)stringValue);
    for (local_40 = 0; uVar1 = local_40,
        sVar3 = std::size<char_const*,16ul>(&parseVfpuCondition::conditions), this_00 = i,
        uVar1 < sVar3; local_40 = local_40 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,parseVfpuCondition::conditions[local_40]);
      bVar2 = Identifier::operator==((Identifier *)this_00,local_50);
      if (bVar2) {
        *(int *)&token->line = (int)local_40;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool MipsParser::parseVfpuCondition(Parser& parser, int& result)
{
	static const char* conditions[] = {
		"fl", "eq", "lt", "le", "tr", "ne", "ge", "gt",
		"ez", "en", "ei", "es", "nz", "nn", "ni", "ns"
	};

	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	const Identifier &stringValue = token.identifierValue();
	for (size_t i = 0; i <  std::size(conditions); i++)
	{
		if (stringValue == conditions[i])
		{
			result = (int)i;
			return true;
		}
	}

	return false;
}